

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLine.cpp
# Opt level: O3

double __thiscall
chrono::geometry::ChLine::CurveSegmentDistMax(ChLine *this,ChLine *complinesegm,int samples)

{
  double dVar1;
  double approxU;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ChVector<double> ptA;
  ChVector<double> ptB;
  double mpos;
  double local_88;
  double dStack_80;
  double local_78;
  ChVector<double> local_68;
  double local_48;
  ulong local_40;
  double local_38;
  
  local_48 = 1.0 / (double)samples;
  auVar2 = ZEXT816(0);
  dVar1 = 0.0;
  do {
    local_68.m_data[2] = 0.0;
    local_40 = auVar2._0_8_;
    local_68.m_data[0] = 0.0;
    local_68.m_data[1] = 0.0;
    approxU = 0.0;
    (*(complinesegm->super_ChGeometry)._vptr_ChGeometry[0xb])(complinesegm,&local_68);
    FindNearestLinePoint(this,&local_68,&local_38,approxU,2e-05);
    local_78 = 0.0;
    local_88 = 0.0;
    dStack_80 = 0.0;
    (*(this->super_ChGeometry)._vptr_ChGeometry[0xb])(local_38,this,&local_88);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_88 - local_68.m_data[0];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (dStack_80 - local_68.m_data[1]) * (dStack_80 - local_68.m_data[1]);
    auVar2 = vfmadd231sd_fma(auVar3,auVar2,auVar2);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_78 - local_68.m_data[2];
    auVar2 = vfmadd231sd_fma(auVar2,auVar5,auVar5);
    auVar2 = vsqrtsd_avx(auVar2,auVar2);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_40;
    auVar2 = vmaxsd_avx(auVar2,auVar4);
    dVar1 = dVar1 + local_48;
  } while (dVar1 < 1.0);
  return auVar2._0_8_;
}

Assistant:

double ChLine::CurveSegmentDistMax(ChLine* complinesegm, int samples) const {
    double mres = 0;
    double par;
    double mdis;
    // distances this<->compare_line
    for (par = 0; par < 1; par = par + 1 / ((double)samples)) {
        double mpos;
        ChVector<> ptB;
        complinesegm->Evaluate(ptB, par);
        this->FindNearestLinePoint(ptB, mpos, 0, 0.00002);
        ChVector<> ptA;
        this->Evaluate(ptA, mpos);
        mdis = Vlength(Vsub(ptA, ptB));
        if (mres < mdis)
            mres = mdis;
    }
    return (mres);
}